

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void save_load(OjaNewton *ON,io_buf *model_file,bool read,bool text)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  ostream *this;
  vw *all_00;
  byte in_CL;
  uint uVar4;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  stringstream msg;
  gd *in_stack_000000e8;
  bool in_stack_000000f6;
  bool in_stack_000000f7;
  io_buf *in_stack_000000f8;
  vw *in_stack_00000100;
  bool resume;
  vw *all;
  undefined4 in_stack_fffffffffffffe2c;
  undefined1 text_00;
  stringstream *in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe4f;
  char *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  _func_int **in_stack_fffffffffffffe60;
  io_buf *in_stack_fffffffffffffe68;
  parameters *in_stack_fffffffffffffeb8;
  OjaNewton *in_stack_fffffffffffffec0;
  
  lVar1 = *in_RDI;
  if ((in_DL & 1) != 0) {
    initialize_regressor((vw *)0x361558);
    OjaNewton::initialize_Z(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  sVar3 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar3 != 0) {
    bVar2 = (bool)(*(byte *)(lVar1 + 0x9e) & 1);
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe50);
    this = std::operator<<((ostream *)&stack0xfffffffffffffe60,":");
    all_00 = (vw *)std::ostream::operator<<(this,bVar2);
    text_00 = (undefined1)((ulong)this >> 0x38);
    std::operator<<((ostream *)all_00,"\n");
    uVar4 = (uint)(in_CL & 1);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58
               ,in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f,in_stack_fffffffffffffe40,
               (bool)text_00);
    if (bVar2 == false) {
      GD::save_load_regressor
                (all_00,(io_buf *)CONCAT44(in_stack_fffffffffffffe2c,uVar4),false,false);
    }
    else {
      GD::save_load_online_state
                (in_stack_00000100,in_stack_000000f8,in_stack_000000f7,in_stack_000000f6,
                 in_stack_000000e8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe50);
  }
  return;
}

Assistant:

void save_load(OjaNewton& ON, io_buf& model_file, bool read, bool text)
{
  vw& all = *ON.all;
  if (read)
  {
    initialize_regressor(all);
    ON.initialize_Z(all.weights);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = all.save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);

    if (resume)
      GD::save_load_online_state(all, model_file, read, text);
    else
      GD::save_load_regressor(all, model_file, read, text);
  }
}